

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

int cppcms_capi_session_load(cppcms_capi_session *session)

{
  logic_error *this;
  long in_RDI;
  session_interface *in_stack_00000158;
  cppcms_capi_session *in_stack_ffffffffffffffe0;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -1;
  }
  else {
    cppcms_capi_session::check(in_stack_ffffffffffffffe0);
    if ((*(byte *)(in_RDI + 0x70) & 1) != 0) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"Session is already loaded");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    booster::hold_ptr<cppcms::session_interface>::operator->
              ((hold_ptr<cppcms::session_interface> *)(in_RDI + 0x78));
    cppcms::session_interface::load(in_stack_00000158);
    *(undefined1 *)(in_RDI + 0x70) = 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int cppcms_capi_session_load(cppcms_capi_session *session)
{
	TRY {
		if(!session)
			return -1;
		session->check();
		if(session->loaded) {
			throw std::logic_error("Session is already loaded");
		}
		session->p->load();
		session->loaded = true;
	}